

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpuintegration.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_400578::CpuIntegrationTest_branch_Test::TestBody
          (CpuIntegrationTest_branch_Test *this)

{
  map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  *this_00;
  mapped_type mVar1;
  void *pvVar2;
  FakeMmu *pFVar3;
  CpuIntegrationTest *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int iVar5;
  mapped_type *pmVar6;
  short sVar7;
  key_type *__k;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  initializer_list<unsigned_char> __l;
  AssertionResult gtest_ar;
  int expected_cycles;
  AssertHelper local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  pointer local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  undefined4 local_48;
  undefined2 local_44;
  undefined1 local_42;
  int local_3c;
  CpuIntegrationTest *local_38;
  
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3e002008eca08a2;
  local_48 = 0x18ef8d0;
  local_44 = 2;
  local_42 = 0;
  __l._M_len = 0xf;
  __l._M_array = (iterator)&local_50;
  local_38 = &this->super_CpuIntegrationTest;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,__l,
             (allocator_type *)&local_3c);
  pbVar4 = local_60;
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT62(local_68._2_6_,CONCAT11(local_68[1],local_68[0]));
  if (pbVar9 != local_60) {
    pFVar3 = &local_38->mmu;
    sVar7 = 0x600;
    do {
      mVar1 = *(mapped_type *)&(pbVar9->_M_dataplus)._M_p;
      local_70.data_._0_2_ = sVar7;
      pmVar6 = std::
               map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
               ::operator[](&pFVar3->memory_,(key_type *)&local_70);
      sVar7 = sVar7 + 1;
      *pmVar6 = mVar1;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pbVar9->_M_dataplus)._M_p + 1);
    } while (pbVar9 != pbVar4);
  }
  pvVar2 = (void *)CONCAT62(local_68._2_6_,CONCAT11(local_68[1],local_68[0]));
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_58 - (long)pvVar2);
  }
  this_01 = local_38;
  local_68[0] = (internal)0xfc;
  local_68[1] = 0xff;
  this_00 = &(local_38->mmu).memory_;
  pmVar6 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_68);
  *pmVar6 = '\0';
  local_68[0] = (internal)0xfd;
  local_68[1] = 0xff;
  pmVar6 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_68);
  *pmVar6 = '\x06';
  local_68[0] = (internal)0xfe;
  local_68[1] = 0xff;
  pmVar6 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,(key_type *)local_68);
  *pmVar6 = 0xad;
  local_68[0] = (internal)0xff;
  local_68[1] = 0xff;
  __k = (key_type *)local_68;
  pmVar6 = std::
           map<unsigned_short,_unsigned_char,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
           ::operator[](this_00,__k);
  *pmVar6 = 0xde;
  (this_01->expected).a = '\0';
  (this_01->expected).x = '\x03';
  (this_01->expected).y = '\0';
  (this_01->expected).p = '\x03';
  (this_01->expected).sp = (this_01->registers).sp + 0xfd;
  (this_01->expected).pc = 0xdead;
  local_3c = 0x43;
  iVar5 = CpuIntegrationTest::run_until_brk(this_01,(int)__k);
  local_50._M_head_impl._0_4_ = iVar5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_68,"expected_cycles","run_until_brk()",&local_3c,(int *)&local_50);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0xab,pcVar8);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_68,"expected","registers",&this_01->expected,&this_01->registers);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0xac,pcVar8);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST_F(CpuIntegrationTest, branch) {
    // Address  Hexdump   Dissassembly
    // -------------------------------
    // $0600    a2 08     LDX #$08
    // $0602    ca        DEX
    // $0603    8e 00 02  STX $0200
    // $0606    e0 03     CPX #$03
    // $0608    d0 f8     BNE $0602
    // $060a    8e 01 02  STX $0201
    // $060d    00        BRK
    load_hex_dump(0x0600,
            {0xa2,
                    0x08,
                    0xca,
                    0x8e,
                    0x00,
                    0x02,
                    0xe0,
                    0x03,
                    0xd0,
                    0xf8,
                    0x8e,
                    0x01,
                    0x02,
                    0x00,
                    0x00}); // Needed for previous BRK dummy read

    set_reset_address(0x0600);
    set_break_address(0xDEAD);

    expected.a = 0x00;
    expected.x = 0x03;
    expected.y = 0x00;
    expected.sp =
            registers.sp - static_cast<uint8_t>(3); // PC (2 bytes) + P (1 byte)
    expected.pc = 0xDEAD;
    expected.p = C_FLAG | Z_FLAG;

    // BNE takes 3 cycles when branch is taken, two when it is not.
    const int expected_cycles =
            2 + (2 + 4 + 2 + 3) * 4 + (2 + 4 + 2 + 2) + 4 + 7;

    EXPECT_EQ(expected_cycles, run_until_brk());
    EXPECT_EQ(expected, registers);
}